

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O1

string_t __thiscall
duckdb::HugeintCastToVarInt::Operation<duckdb::uhugeint_t>
          (HugeintCastToVarInt *this,uhugeint_t int_value,Vector *result)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  byte bVar24;
  long lVar25;
  StringVector *extraout_RDX;
  StringVector *extraout_RDX_00;
  StringVector *len;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  char *blob_00;
  double dVar31;
  undefined1 auVar32 [16];
  HugeintCastToVarInt *pHVar33;
  undefined1 in_XMM1 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int iVar53;
  int iVar56;
  int iVar57;
  undefined1 auVar54 [16];
  int iVar58;
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar72;
  int iVar76;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  string_t blob;
  undefined1 local_40 [16];
  
  uVar28 = int_value.lower;
  uVar27 = uVar28;
  if (uVar28 != 0xffffffffffffffff) {
    uVar27 = 0;
    len = (StringVector *)int_value.upper;
    if (uVar28 == 0) goto LAB_00f162f5;
    uVar27 = uVar28 + 1;
  }
  auVar54._8_4_ = (int)(uVar27 >> 0x20);
  auVar54._0_8_ = uVar27;
  auVar54._12_4_ = 0x45300000;
  in_XMM1._0_8_ = (double)CONCAT44(0x43300000,(int)uVar27) - 4503599627370496.0;
  in_XMM1._8_8_ = auVar54._8_8_ - 1.9342813113834067e+25;
  dVar31 = log2(in_XMM1._8_8_ + in_XMM1._0_8_);
  dVar31 = ceil(dVar31 * 0.125);
  uVar27 = (ulong)dVar31;
  len = extraout_RDX;
LAB_00f162f5:
  uVar26 = (uint)uVar27;
  if (uVar26 == 0) {
    if (this == (HugeintCastToVarInt *)0xffffffffffffffff) {
      pHVar33 = (HugeintCastToVarInt *)0xffffffffffffffff;
    }
    else {
      pHVar33 = this + 1;
    }
    auVar59._8_4_ = (int)((ulong)pHVar33 >> 0x20);
    auVar59._0_8_ = pHVar33;
    auVar59._12_4_ = 0x45300000;
    in_XMM1._0_8_ = (double)CONCAT44(0x43300000,(int)pHVar33) - 4503599627370496.0;
    in_XMM1._8_8_ = auVar59._8_8_ - 1.9342813113834067e+25;
    dVar31 = log2(in_XMM1._8_8_ + in_XMM1._0_8_);
    dVar31 = ceil(dVar31 * 0.125);
    iVar29 = (int)(long)dVar31;
    len = extraout_RDX_00;
  }
  else {
    iVar29 = uVar26 + 8;
  }
  uVar30 = iVar29 + (uint)(iVar29 == 0);
  local_40 = (undefined1  [16])
             StringVector::EmptyString
                       ((StringVector *)int_value.upper,(Vector *)(ulong)(uVar30 + 3),(idx_t)len);
  blob_00 = local_40._8_8_;
  if (local_40._0_4_ < 0xd) {
    blob_00 = local_40 + 4;
  }
  Varint::SetHeader(blob_00,(ulong)uVar30,false);
  if ((int)uVar26 < 1) {
    uVar27 = 3;
  }
  else {
    lVar25 = (uVar27 & 0xffffffff) * 8;
    uVar27 = 3;
    do {
      lVar25 = lVar25 + -8;
      blob_00[uVar27] = (char)(uVar28 >> ((byte)lVar25 & 0x3f));
      uVar27 = uVar27 + 1;
    } while (uVar26 + 3 != uVar27);
  }
  if (-1 < (int)(~uVar26 + uVar30)) {
    lVar25 = (ulong)(uVar30 - uVar26) - 1;
    auVar32._8_4_ = (int)lVar25;
    auVar32._0_8_ = lVar25;
    auVar32._12_4_ = (int)((ulong)lVar25 >> 0x20);
    iVar29 = (~uVar26 + uVar30) * 8;
    uVar28 = 0;
    do {
      auVar51._8_4_ = (int)uVar28;
      auVar51._0_8_ = uVar28;
      auVar51._12_4_ = (int)(uVar28 >> 0x20);
      auVar54 = auVar32 ^ _DAT_01dd7b40;
      auVar59 = (auVar51 | _DAT_01dd7b30) ^ _DAT_01dd7b40;
      iVar53 = auVar54._0_4_;
      iVar72 = -(uint)(iVar53 < auVar59._0_4_);
      iVar56 = auVar54._4_4_;
      auVar61._4_4_ = -(uint)(iVar56 < auVar59._4_4_);
      iVar57 = auVar54._8_4_;
      iVar76 = -(uint)(iVar57 < auVar59._8_4_);
      iVar58 = auVar54._12_4_;
      auVar61._12_4_ = -(uint)(iVar58 < auVar59._12_4_);
      auVar43._4_4_ = iVar72;
      auVar43._0_4_ = iVar72;
      auVar43._8_4_ = iVar76;
      auVar43._12_4_ = iVar76;
      auVar54 = pshuflw(in_XMM1,auVar43,0xe8);
      auVar60._4_4_ = -(uint)(auVar59._4_4_ == iVar56);
      auVar60._12_4_ = -(uint)(auVar59._12_4_ == iVar58);
      auVar60._0_4_ = auVar60._4_4_;
      auVar60._8_4_ = auVar60._12_4_;
      auVar43 = pshuflw(in_XMM2,auVar60,0xe8);
      auVar61._0_4_ = auVar61._4_4_;
      auVar61._8_4_ = auVar61._12_4_;
      auVar59 = pshuflw(auVar54,auVar61,0xe8);
      auVar34._8_4_ = 0xffffffff;
      auVar34._0_8_ = 0xffffffffffffffff;
      auVar34._12_4_ = 0xffffffff;
      auVar34 = (auVar59 | auVar43 & auVar54) ^ auVar34;
      auVar54 = packssdw(auVar34,auVar34);
      bVar24 = (byte)iVar29;
      if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        blob_00[uVar28 + uVar27] = (char)((ulong)this >> (bVar24 & 0x38));
      }
      auVar11._4_4_ = iVar72;
      auVar11._0_4_ = iVar72;
      auVar11._8_4_ = iVar76;
      auVar11._12_4_ = iVar76;
      auVar61 = auVar60 & auVar11 | auVar61;
      auVar54 = packssdw(auVar61,auVar61);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar1,auVar54 ^ auVar1);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._0_4_ >> 8 & 1) != 0) {
        blob_00[uVar28 + uVar27 + 1] = (char)((ulong)this >> (bVar24 - 8 & 0x38));
      }
      auVar54 = (auVar51 | _DAT_01dd8ba0) ^ _DAT_01dd7b40;
      auVar44._0_4_ = -(uint)(iVar53 < auVar54._0_4_);
      auVar44._4_4_ = -(uint)(iVar56 < auVar54._4_4_);
      auVar44._8_4_ = -(uint)(iVar57 < auVar54._8_4_);
      auVar44._12_4_ = -(uint)(iVar58 < auVar54._12_4_);
      auVar62._4_4_ = auVar44._0_4_;
      auVar62._0_4_ = auVar44._0_4_;
      auVar62._8_4_ = auVar44._8_4_;
      auVar62._12_4_ = auVar44._8_4_;
      iVar72 = -(uint)(auVar54._4_4_ == iVar56);
      iVar76 = -(uint)(auVar54._12_4_ == iVar58);
      auVar12._4_4_ = iVar72;
      auVar12._0_4_ = iVar72;
      auVar12._8_4_ = iVar76;
      auVar12._12_4_ = iVar76;
      auVar73._4_4_ = auVar44._4_4_;
      auVar73._0_4_ = auVar44._4_4_;
      auVar73._8_4_ = auVar44._12_4_;
      auVar73._12_4_ = auVar44._12_4_;
      auVar54 = auVar12 & auVar62 | auVar73;
      auVar54 = packssdw(auVar54,auVar54);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar2,auVar54 ^ auVar2);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._0_4_ >> 0x10 & 1) != 0) {
        blob_00[uVar28 + uVar27 + 2] = (char)((ulong)this >> (bVar24 - 0x10 & 0x38));
      }
      auVar54 = pshufhw(auVar54,auVar62,0x84);
      auVar13._4_4_ = iVar72;
      auVar13._0_4_ = iVar72;
      auVar13._8_4_ = iVar76;
      auVar13._12_4_ = iVar76;
      auVar34 = pshufhw(auVar44,auVar13,0x84);
      auVar59 = pshufhw(auVar54,auVar73,0x84);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar35 = (auVar59 | auVar34 & auVar54) ^ auVar35;
      auVar54 = packssdw(auVar35,auVar35);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._0_4_ >> 0x18 & 1) != 0) {
        blob_00[uVar28 + uVar27 + 3] = (char)((ulong)this >> (bVar24 - 0x18 & 0x38));
      }
      auVar54 = (auVar51 | _DAT_01dd8b90) ^ _DAT_01dd7b40;
      auVar45._0_4_ = -(uint)(iVar53 < auVar54._0_4_);
      auVar45._4_4_ = -(uint)(iVar56 < auVar54._4_4_);
      auVar45._8_4_ = -(uint)(iVar57 < auVar54._8_4_);
      auVar45._12_4_ = -(uint)(iVar58 < auVar54._12_4_);
      auVar14._4_4_ = auVar45._0_4_;
      auVar14._0_4_ = auVar45._0_4_;
      auVar14._8_4_ = auVar45._8_4_;
      auVar14._12_4_ = auVar45._8_4_;
      auVar34 = pshuflw(auVar73,auVar14,0xe8);
      auVar36._0_4_ = -(uint)(auVar54._0_4_ == iVar53);
      auVar36._4_4_ = -(uint)(auVar54._4_4_ == iVar56);
      auVar36._8_4_ = -(uint)(auVar54._8_4_ == iVar57);
      auVar36._12_4_ = -(uint)(auVar54._12_4_ == iVar58);
      auVar63._4_4_ = auVar36._4_4_;
      auVar63._0_4_ = auVar36._4_4_;
      auVar63._8_4_ = auVar36._12_4_;
      auVar63._12_4_ = auVar36._12_4_;
      auVar54 = pshuflw(auVar36,auVar63,0xe8);
      auVar64._4_4_ = auVar45._4_4_;
      auVar64._0_4_ = auVar45._4_4_;
      auVar64._8_4_ = auVar45._12_4_;
      auVar64._12_4_ = auVar45._12_4_;
      auVar59 = pshuflw(auVar45,auVar64,0xe8);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 & auVar34,(auVar59 | auVar54 & auVar34) ^ auVar3);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        blob_00[uVar28 + uVar27 + 4] = (char)((ulong)this >> (bVar24 - 0x20 & 0x38));
      }
      auVar15._4_4_ = auVar45._0_4_;
      auVar15._0_4_ = auVar45._0_4_;
      auVar15._8_4_ = auVar45._8_4_;
      auVar15._12_4_ = auVar45._8_4_;
      auVar64 = auVar63 & auVar15 | auVar64;
      auVar59 = packssdw(auVar64,auVar64);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54,auVar59 ^ auVar4);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._4_2_ >> 8 & 1) != 0) {
        blob_00[uVar28 + uVar27 + 5] = (char)((ulong)this >> (bVar24 - 0x28 & 0x38));
      }
      auVar54 = (auVar51 | _DAT_01dd8b80) ^ _DAT_01dd7b40;
      auVar46._0_4_ = -(uint)(iVar53 < auVar54._0_4_);
      auVar46._4_4_ = -(uint)(iVar56 < auVar54._4_4_);
      auVar46._8_4_ = -(uint)(iVar57 < auVar54._8_4_);
      auVar46._12_4_ = -(uint)(iVar58 < auVar54._12_4_);
      auVar65._4_4_ = auVar46._0_4_;
      auVar65._0_4_ = auVar46._0_4_;
      auVar65._8_4_ = auVar46._8_4_;
      auVar65._12_4_ = auVar46._8_4_;
      iVar72 = -(uint)(auVar54._4_4_ == iVar56);
      iVar76 = -(uint)(auVar54._12_4_ == iVar58);
      auVar16._4_4_ = iVar72;
      auVar16._0_4_ = iVar72;
      auVar16._8_4_ = iVar76;
      auVar16._12_4_ = iVar76;
      auVar74._4_4_ = auVar46._4_4_;
      auVar74._0_4_ = auVar46._4_4_;
      auVar74._8_4_ = auVar46._12_4_;
      auVar74._12_4_ = auVar46._12_4_;
      auVar54 = auVar16 & auVar65 | auVar74;
      auVar54 = packssdw(auVar54,auVar54);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar5,auVar54 ^ auVar5);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        blob_00[uVar28 + uVar27 + 6] = (char)((ulong)this >> (bVar24 - 0x30 & 0x38));
      }
      auVar54 = pshufhw(auVar54,auVar65,0x84);
      auVar17._4_4_ = iVar72;
      auVar17._0_4_ = iVar72;
      auVar17._8_4_ = iVar76;
      auVar17._12_4_ = iVar76;
      auVar34 = pshufhw(auVar46,auVar17,0x84);
      auVar59 = pshufhw(auVar54,auVar74,0x84);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar37 = (auVar59 | auVar34 & auVar54) ^ auVar37;
      auVar54 = packssdw(auVar37,auVar37);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._6_2_ >> 8 & 1) != 0) {
        blob_00[uVar28 + uVar27 + 7] = (char)((ulong)this >> (bVar24 - 0x38 & 0x38));
      }
      auVar54 = (auVar51 | _DAT_01dd8b70) ^ _DAT_01dd7b40;
      auVar47._0_4_ = -(uint)(iVar53 < auVar54._0_4_);
      auVar47._4_4_ = -(uint)(iVar56 < auVar54._4_4_);
      auVar47._8_4_ = -(uint)(iVar57 < auVar54._8_4_);
      auVar47._12_4_ = -(uint)(iVar58 < auVar54._12_4_);
      auVar18._4_4_ = auVar47._0_4_;
      auVar18._0_4_ = auVar47._0_4_;
      auVar18._8_4_ = auVar47._8_4_;
      auVar18._12_4_ = auVar47._8_4_;
      auVar34 = pshuflw(auVar74,auVar18,0xe8);
      auVar38._0_4_ = -(uint)(auVar54._0_4_ == iVar53);
      auVar38._4_4_ = -(uint)(auVar54._4_4_ == iVar56);
      auVar38._8_4_ = -(uint)(auVar54._8_4_ == iVar57);
      auVar38._12_4_ = -(uint)(auVar54._12_4_ == iVar58);
      auVar66._4_4_ = auVar38._4_4_;
      auVar66._0_4_ = auVar38._4_4_;
      auVar66._8_4_ = auVar38._12_4_;
      auVar66._12_4_ = auVar38._12_4_;
      auVar54 = pshuflw(auVar38,auVar66,0xe8);
      auVar67._4_4_ = auVar47._4_4_;
      auVar67._0_4_ = auVar47._4_4_;
      auVar67._8_4_ = auVar47._12_4_;
      auVar67._12_4_ = auVar47._12_4_;
      auVar59 = pshuflw(auVar47,auVar67,0xe8);
      auVar48._8_4_ = 0xffffffff;
      auVar48._0_8_ = 0xffffffffffffffff;
      auVar48._12_4_ = 0xffffffff;
      auVar48 = (auVar59 | auVar54 & auVar34) ^ auVar48;
      auVar59 = packssdw(auVar48,auVar48);
      auVar54 = packsswb(auVar54 & auVar34,auVar59);
      if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        blob_00[uVar28 + uVar27 + 8] = (char)((ulong)this >> (bVar24 - 0x40 & 0x38));
      }
      auVar19._4_4_ = auVar47._0_4_;
      auVar19._0_4_ = auVar47._0_4_;
      auVar19._8_4_ = auVar47._8_4_;
      auVar19._12_4_ = auVar47._8_4_;
      auVar67 = auVar66 & auVar19 | auVar67;
      auVar59 = packssdw(auVar67,auVar67);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 ^ auVar6,auVar59 ^ auVar6);
      auVar54 = packsswb(auVar54,auVar59);
      if ((auVar54._8_2_ >> 8 & 1) != 0) {
        blob_00[uVar28 + uVar27 + 9] = (char)((ulong)this >> (bVar24 + 0xb8 & 0x38));
      }
      auVar54 = (auVar51 | _DAT_01dd8b60) ^ _DAT_01dd7b40;
      auVar49._0_4_ = -(uint)(iVar53 < auVar54._0_4_);
      auVar49._4_4_ = -(uint)(iVar56 < auVar54._4_4_);
      auVar49._8_4_ = -(uint)(iVar57 < auVar54._8_4_);
      auVar49._12_4_ = -(uint)(iVar58 < auVar54._12_4_);
      auVar68._4_4_ = auVar49._0_4_;
      auVar68._0_4_ = auVar49._0_4_;
      auVar68._8_4_ = auVar49._8_4_;
      auVar68._12_4_ = auVar49._8_4_;
      iVar72 = -(uint)(auVar54._4_4_ == iVar56);
      iVar76 = -(uint)(auVar54._12_4_ == iVar58);
      auVar20._4_4_ = iVar72;
      auVar20._0_4_ = iVar72;
      auVar20._8_4_ = iVar76;
      auVar20._12_4_ = iVar76;
      auVar75._4_4_ = auVar49._4_4_;
      auVar75._0_4_ = auVar49._4_4_;
      auVar75._8_4_ = auVar49._12_4_;
      auVar75._12_4_ = auVar49._12_4_;
      auVar54 = auVar20 & auVar68 | auVar75;
      auVar54 = packssdw(auVar54,auVar54);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar7,auVar54 ^ auVar7);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        blob_00[uVar28 + uVar27 + 10] = (char)((ulong)this >> (bVar24 + 0xb0 & 0x38));
      }
      auVar54 = pshufhw(auVar54,auVar68,0x84);
      auVar21._4_4_ = iVar72;
      auVar21._0_4_ = iVar72;
      auVar21._8_4_ = iVar76;
      auVar21._12_4_ = iVar76;
      auVar34 = pshufhw(auVar49,auVar21,0x84);
      auVar59 = pshufhw(auVar54,auVar75,0x84);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar59 | auVar34 & auVar54) ^ auVar39;
      auVar54 = packssdw(auVar39,auVar39);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._10_2_ >> 8 & 1) != 0) {
        blob_00[uVar28 + uVar27 + 0xb] = (char)((ulong)this >> (bVar24 + 0xa8 & 0x38));
      }
      auVar54 = (auVar51 | _DAT_01dd8b50) ^ _DAT_01dd7b40;
      auVar50._0_4_ = -(uint)(iVar53 < auVar54._0_4_);
      auVar50._4_4_ = -(uint)(iVar56 < auVar54._4_4_);
      auVar50._8_4_ = -(uint)(iVar57 < auVar54._8_4_);
      auVar50._12_4_ = -(uint)(iVar58 < auVar54._12_4_);
      auVar22._4_4_ = auVar50._0_4_;
      auVar22._0_4_ = auVar50._0_4_;
      auVar22._8_4_ = auVar50._8_4_;
      auVar22._12_4_ = auVar50._8_4_;
      auVar34 = pshuflw(auVar75,auVar22,0xe8);
      auVar40._0_4_ = -(uint)(auVar54._0_4_ == iVar53);
      auVar40._4_4_ = -(uint)(auVar54._4_4_ == iVar56);
      auVar40._8_4_ = -(uint)(auVar54._8_4_ == iVar57);
      auVar40._12_4_ = -(uint)(auVar54._12_4_ == iVar58);
      auVar69._4_4_ = auVar40._4_4_;
      auVar69._0_4_ = auVar40._4_4_;
      auVar69._8_4_ = auVar40._12_4_;
      auVar69._12_4_ = auVar40._12_4_;
      auVar54 = pshuflw(auVar40,auVar69,0xe8);
      auVar70._4_4_ = auVar50._4_4_;
      auVar70._0_4_ = auVar50._4_4_;
      auVar70._8_4_ = auVar50._12_4_;
      auVar70._12_4_ = auVar50._12_4_;
      auVar59 = pshuflw(auVar50,auVar70,0xe8);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 & auVar34,(auVar59 | auVar54 & auVar34) ^ auVar8);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        blob_00[uVar28 + uVar27 + 0xc] = (char)((ulong)this >> (bVar24 + 0xa0 & 0x38));
      }
      auVar23._4_4_ = auVar50._0_4_;
      auVar23._0_4_ = auVar50._0_4_;
      auVar23._8_4_ = auVar50._8_4_;
      auVar23._12_4_ = auVar50._8_4_;
      auVar70 = auVar69 & auVar23 | auVar70;
      auVar59 = packssdw(auVar70,auVar70);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54,auVar59 ^ auVar9);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._12_2_ >> 8 & 1) != 0) {
        blob_00[uVar28 + uVar27 + 0xd] = (char)((ulong)this >> (bVar24 + 0x98 & 0x38));
      }
      auVar54 = (auVar51 | _DAT_01dd8b40) ^ _DAT_01dd7b40;
      auVar41._0_4_ = -(uint)(iVar53 < auVar54._0_4_);
      auVar41._4_4_ = -(uint)(iVar56 < auVar54._4_4_);
      auVar41._8_4_ = -(uint)(iVar57 < auVar54._8_4_);
      auVar41._12_4_ = -(uint)(iVar58 < auVar54._12_4_);
      auVar71._4_4_ = auVar41._0_4_;
      auVar71._0_4_ = auVar41._0_4_;
      auVar71._8_4_ = auVar41._8_4_;
      auVar71._12_4_ = auVar41._8_4_;
      auVar52._4_4_ = -(uint)(auVar54._4_4_ == iVar56);
      auVar52._12_4_ = -(uint)(auVar54._12_4_ == iVar58);
      auVar52._0_4_ = auVar52._4_4_;
      auVar52._8_4_ = auVar52._12_4_;
      auVar55._4_4_ = auVar41._4_4_;
      auVar55._0_4_ = auVar41._4_4_;
      auVar55._8_4_ = auVar41._12_4_;
      auVar55._12_4_ = auVar41._12_4_;
      auVar59 = auVar52 & auVar71 | auVar55;
      auVar54 = packssdw(auVar41,auVar59);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar10,auVar54 ^ auVar10);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        blob_00[uVar28 + uVar27 + 0xe] = (char)((ulong)this >> (bVar24 + 0x90 & 0x38));
      }
      auVar54 = pshufhw(auVar54,auVar71,0x84);
      in_XMM2 = pshufhw(auVar59,auVar52,0x84);
      in_XMM2 = in_XMM2 & auVar54;
      auVar54 = pshufhw(auVar54,auVar55,0x84);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar42 = (auVar54 | in_XMM2) ^ auVar42;
      auVar54 = packssdw(auVar42,auVar42);
      in_XMM1 = packsswb(auVar54,auVar54);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        blob_00[uVar28 + uVar27 + 0xf] = (char)((ulong)this >> (bVar24 + 0x88 & 0x38));
      }
      uVar28 = uVar28 + 0x10;
      iVar29 = iVar29 + -0x80;
    } while (((ulong)(uVar30 - uVar26) + 0xf & 0xfffffffffffffff0) != uVar28);
  }
  uVar27 = (ulong)(uint)local_40._0_4_;
  if (uVar27 < 0xd) {
    switchD_01306cb1::default(local_40 + 4 + uVar27,0,0xc - uVar27);
  }
  else {
    local_40._4_4_ = *(undefined4 *)local_40._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_40;
}

Assistant:

string_t HugeintCastToVarInt::Operation(uhugeint_t int_value, Vector &result) {
	uint32_t data_byte_size;
	if (int_value.upper != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size =
		    (int_value.upper == 0) ? 0 : static_cast<uint32_t>(std::ceil(std::log2(int_value.upper + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(int_value.upper) / 8.0));
	}

	uint32_t upper_byte_size = data_byte_size;
	if (data_byte_size > 0) {
		// If we have at least one byte on the upper side, the bottom side is complete
		data_byte_size += 8;
	} else {
		if (int_value.lower != NumericLimits<uint64_t>::Maximum()) {
			data_byte_size += static_cast<uint32_t>(std::ceil(std::log2(int_value.lower + 1) / 8.0));
		} else {
			data_byte_size += static_cast<uint32_t>(std::ceil(std::log2(int_value.lower) / 8.0));
		}
	}
	if (data_byte_size == 0) {
		data_byte_size++;
	}
	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, false);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(upper_byte_size) - 1; i >= 0; --i) {
		writable_blob[wb_idx++] = static_cast<char>(int_value.upper >> i * 8 & 0xFF);
	}
	for (int i = static_cast<int>(data_byte_size - upper_byte_size) - 1; i >= 0; --i) {
		writable_blob[wb_idx++] = static_cast<char>(int_value.lower >> i * 8 & 0xFF);
	}
	blob.Finalize();
	return blob;
}